

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall soplex::SSVectorBase<double>::setValue(SSVectorBase<double> *this,int i,double x)

{
  int iVar1;
  int *piVar2;
  Tolerances *this_00;
  uint uVar3;
  double dVar4;
  ulong in_XMM0_Qb;
  double dVar5;
  int local_3c;
  double local_38;
  ulong uStack_30;
  double local_28;
  ulong uStack_20;
  
  if (this->setupStatus == true) {
    local_3c = i;
    local_38 = x;
    uStack_30 = in_XMM0_Qb;
    uVar3 = IdxSet::pos(&this->super_IdxSet,i);
    if ((int)uVar3 < 0) {
      dVar5 = ABS(local_38);
      this_00 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 == (Tolerances *)0x0) {
        dVar4 = 0.0;
      }
      else {
        local_28 = dVar5;
        uStack_20 = uStack_30 & 0x7fffffffffffffff;
        dVar4 = Tolerances::epsilon(this_00);
        dVar5 = local_28;
      }
      x = local_38;
      if (dVar4 < dVar5) {
        IdxSet::add(&this->super_IdxSet,1,&local_3c);
        x = local_38;
        i = local_3c;
      }
    }
    else {
      x = local_38;
      if ((local_38 == 0.0) && (!NAN(local_38))) {
        piVar2 = (this->super_IdxSet).idx;
        (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[piVar2[uVar3]] = 0.0;
        iVar1 = (this->super_IdxSet).num;
        (this->super_IdxSet).num = iVar1 + -1;
        piVar2[uVar3] = piVar2[(long)iVar1 + -1];
      }
    }
  }
  (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[i] = x;
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }